

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O0

void __thiscall CLabelTable::DumpForUnreal(CLabelTable *this)

{
  bool bVar1;
  int iVar2;
  uint value;
  char *pcVar3;
  CDevicePage *pCVar4;
  reference __k;
  mapped_type *pmVar5;
  FILE *__dest;
  int local_8e4;
  uint local_8d8;
  uint local_8d4;
  int iStack_8b8;
  int lvalue;
  int fakeZx128Pages [4];
  int page;
  mapped_type *symbol;
  key_type *name;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  order;
  int ADR_MASK;
  int PAGE_MASK;
  string local_848;
  FILE *local_828;
  FILE *FP_UnrealList;
  char *ep;
  char ln [2048];
  CLabelTable *this_local;
  
  local_828 = (FILE *)SJ_fopen((path *)Options::UnrealLabelListFName_abi_cxx11_,"w");
  if (local_828 == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string
              (&local_848,(path *)Options::UnrealLabelListFName_abi_cxx11_);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    Error("opening file for write",pcVar3,FATAL);
    std::__cxx11::string::~string((string *)&local_848);
  }
  if (DeviceID == (char *)0x0) {
    local_8d4 = 0x3fff;
  }
  else {
    pCVar4 = CDevice::GetPage(Device,0);
    local_8d4 = pCVar4->Size - 1;
  }
  if ((Options::EmitVirtualLabels & 1) == 0) {
    local_8d8 = local_8d4;
  }
  else {
    local_8d8 = 0xffff;
  }
  order.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_8d8;
  getDumpOrder((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1,&this->symbols);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
  name = (key_type *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&name), bVar1) {
    __k = __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>_>
             ::at(&this->symbols,__k);
    if (pmVar5->page != -1) {
      if ((Options::EmitVirtualLabels & 1) == 0) {
        local_8e4 = (int)pmVar5->page;
      }
      else {
        local_8e4 = 0x7f80;
      }
      fakeZx128Pages[3] = local_8e4;
      iVar2 = strcmp(DeviceID,"ZXSPECTRUM48");
      if ((iVar2 == 0) && (fakeZx128Pages[3] < 4)) {
        _iStack_8b8 = 0x500007f00;
        fakeZx128Pages[0] = 2;
        fakeZx128Pages[1] = 0;
        fakeZx128Pages[3] = (&iStack_8b8)[fakeZx128Pages[3]];
      }
      value = pmVar5->value &
              order.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      FP_UnrealList = (FILE *)&ep;
      if (fakeZx128Pages[3] < 0x7f00) {
        iVar2 = snprintf((char *)FP_UnrealList,0x800,"%02d",(ulong)(fakeZx128Pages[3] & 0xff));
        FP_UnrealList = FP_UnrealList + iVar2;
      }
      *FP_UnrealList = (FILE)0x3a;
      FP_UnrealList = FP_UnrealList + 1;
      PrintHexAlt((char **)&FP_UnrealList,value);
      __dest = FP_UnrealList + 1;
      *FP_UnrealList = (FILE)0x20;
      FP_UnrealList = __dest;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      strcpy((char *)__dest,pcVar3);
      strncat((char *)FP_UnrealList,anon_var_dwarf_b6a10 + 5,0x800);
      fputs((char *)&ep,local_828);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  fclose(local_828);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  return;
}

Assistant:

void CLabelTable::DumpForUnreal() {
	char ln[LINEMAX], * ep;
	FILE* FP_UnrealList;
	if (!FOPEN_ISOK(FP_UnrealList, Options::UnrealLabelListFName, "w")) {
		Error("opening file for write", Options::UnrealLabelListFName.string().c_str(), FATAL);
	}
	const int PAGE_MASK = DeviceID ? Device->GetPage(0)->Size - 1 : 0x3FFF;
	const int ADR_MASK = Options::EmitVirtualLabels ? 0xFFFF : PAGE_MASK;
	const auto order = getDumpOrder(symbols);
	for (const symbol_map_t::key_type& name: order) {
		const symbol_map_t::mapped_type& symbol = symbols.at(name);
		if (LABEL_PAGE_UNDEFINED == symbol.page) continue;
		int page = Options::EmitVirtualLabels ? LABEL_PAGE_OUT_OF_BOUNDS : symbol.page;
		if (!strcmp(DeviceID, "ZXSPECTRUM48") && page < 4) {	//TODO fix this properly?
			// convert pages {0, 1, 2, 3} of ZX48 into ZX128-like {ROM, 5, 2, 0}
			// this can be fooled when there were multiple devices used, Label doesn't know into
			// which device it does belong, so even ZX128 labels will be converted.
			const int fakeZx128Pages[] = {LABEL_PAGE_ROM, 5, 2, 0};
			page = fakeZx128Pages[page];
		}
		int lvalue = symbol.value & ADR_MASK;
		ep = ln;

		if (page < LABEL_PAGE_ROM) ep += SPRINTF1(ep, LINEMAX, "%02d", page&255);
		*(ep++) = ':';
		PrintHexAlt(ep, lvalue);

		*(ep++) = ' ';
		STRCPY(ep, LINEMAX-(ep-ln), name.c_str());
		STRCAT(ep, LINEMAX, "\n");
		fputs(ln, FP_UnrealList);
	}
	fclose(FP_UnrealList);
}